

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

timediff_t Curl_pp_state_timeout(Curl_easy *data,pingpong *pp,_Bool disconnecting)

{
  undefined8 uVar1;
  undefined4 uVar2;
  timediff_t tVar3;
  ulong uVar4;
  long lVar5;
  curltime cVar6;
  curltime newer;
  curltime older;
  curltime now;
  curltime local_30;
  
  uVar4 = (ulong)(data->set).server_response_timeout;
  if (uVar4 == 0) {
    uVar4 = pp->response_time;
  }
  cVar6 = Curl_now();
  local_30.tv_sec = cVar6.tv_sec;
  local_30.tv_usec = cVar6.tv_usec;
  uVar1 = (pp->response).tv_sec;
  uVar2 = (pp->response).tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar6._0_12_,0);
  newer.tv_usec = SUB124(cVar6._0_12_,8);
  older._12_4_ = 0;
  tVar3 = Curl_timediff(newer,older);
  lVar5 = uVar4 - tVar3;
  if ((data->set).timeout != 0 && !disconnecting) {
    tVar3 = Curl_timeleft(data,&local_30,false);
    if (tVar3 <= lVar5) {
      lVar5 = tVar3;
    }
  }
  if (disconnecting) {
    tVar3 = Curl_timeleft(data,(curltime *)0x0,false);
    if (tVar3 < 1) {
      tVar3 = 0;
    }
    if (tVar3 <= lVar5) {
      lVar5 = tVar3;
    }
  }
  return lVar5;
}

Assistant:

timediff_t Curl_pp_state_timeout(struct Curl_easy *data,
                                 struct pingpong *pp, bool disconnecting)
{
  timediff_t timeout_ms; /* in milliseconds */
  timediff_t response_time = (data->set.server_response_timeout) ?
    data->set.server_response_timeout : pp->response_time;
  struct curltime now = Curl_now();

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time - Curl_timediff(now, pp->response);

  if(data->set.timeout && !disconnecting) {
    /* if timeout is requested, find out how much overall remains */
    timediff_t timeout2_ms = Curl_timeleft(data, &now, FALSE);
    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  if(disconnecting) {
    timediff_t total_left_ms = Curl_timeleft(data, NULL, FALSE);
    timeout_ms = CURLMIN(timeout_ms, CURLMAX(total_left_ms, 0));
  }

  return timeout_ms;
}